

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

void __thiscall Assimp::XGLImporter::ReadMaterial(XGLImporter *this,TempScope *scope)

{
  ai_real *__return_storage_ptr__;
  value_type paVar1;
  bool bVar2;
  aiMaterial *this_00;
  mapped_type *ppaVar3;
  float local_98;
  float local_94;
  float f_1;
  float f;
  aiColor3D c_3;
  aiColor3D c_2;
  aiColor3D c_1;
  aiColor3D c;
  string *s;
  value_type local_28;
  aiMaterial *mat;
  TempScope *pTStack_18;
  uint mat_id;
  TempScope *scope_local;
  XGLImporter *this_local;
  
  pTStack_18 = scope;
  scope_local = (TempScope *)this;
  mat._4_4_ = ReadIDAttr(this);
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_28 = this_00;
  while (bVar2 = ReadElementUpToClosing(this,"mat"), paVar1 = local_28, bVar2) {
    __return_storage_ptr__ = &c.g;
    GetElementName_abi_cxx11_((string *)__return_storage_ptr__,this);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,"amb");
    if (bVar2) {
      ReadCol3((XGLImporter *)&c_1.g);
      aiMaterial::AddProperty(local_28,(aiColor3D *)&c_1.g,1,"$clr.ambient",0,0);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __return_storage_ptr__,"diff");
      if (bVar2) {
        ReadCol3((XGLImporter *)&c_2.g);
        aiMaterial::AddProperty(local_28,(aiColor3D *)&c_2.g,1,"$clr.diffuse",0,0);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__return_storage_ptr__,"spec");
        if (bVar2) {
          ReadCol3((XGLImporter *)&c_3.g);
          aiMaterial::AddProperty(local_28,(aiColor3D *)&c_3.g,1,"$clr.specular",0,0);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__return_storage_ptr__,"emiss");
          if (bVar2) {
            ReadCol3((XGLImporter *)&f_1);
            aiMaterial::AddProperty(local_28,(aiColor3D *)&f_1,1,"$clr.emissive",0,0);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__return_storage_ptr__,"alpha");
            if (bVar2) {
              local_94 = ReadFloat(this);
              aiMaterial::AddProperty(local_28,&local_94,1,"$mat.opacity",0,0);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__return_storage_ptr__,"shine");
              if (bVar2) {
                local_98 = ReadFloat(this);
                aiMaterial::AddProperty(local_28,&local_98,1,"$mat.shininess",0,0);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&c.g);
  }
  ppaVar3 = std::
            map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
            ::operator[](&pTStack_18->materials,(key_type *)((long)&mat + 4));
  *ppaVar3 = paVar1;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
            (&pTStack_18->materials_linear,&local_28);
  return;
}

Assistant:

void XGLImporter::ReadMaterial(TempScope& scope) {
    const unsigned int mat_id = ReadIDAttr();

    aiMaterial *mat(new aiMaterial );
    while (ReadElementUpToClosing("mat"))  {
        const std::string& s = GetElementName();
        if (s == "amb") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);
        }
        else if (s == "diff") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_DIFFUSE);
        }
        else if (s == "spec") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);
        }
        else if (s == "emiss") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_EMISSIVE);
        }
        else if (s == "alpha") {
            const float f = ReadFloat();
            mat->AddProperty(&f,1,AI_MATKEY_OPACITY);
        }
        else if (s == "shine") {
            const float f = ReadFloat();
            mat->AddProperty(&f,1,AI_MATKEY_SHININESS);
        }
    }

    scope.materials[mat_id] = mat;
    scope.materials_linear.push_back(mat);
}